

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventAgentTest.cpp
# Opt level: O3

bool __thiscall TestClass::SyncRetFunc2(TestClass *this,uint64_t *p1,uint32_t p2)

{
  char cVar1;
  SyncRetEventAgent<bool> *this_00;
  ssize_t sVar2;
  void *__buf;
  int in_R8D;
  
  cVar1 = EventDispatcher::isThreadCurrent();
  if (cVar1 != '\0') {
    *p1 = *p1 + 0x400;
    return true;
  }
  this_00 = (SyncRetEventAgent<bool> *)
            operator_new(0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/eventAgentTest.cpp"
                         ,0x10a);
  *(undefined8 *)&this_00->field_0x8 = 0xfffffffb00000000;
  *(undefined4 *)&this_00->field_0x10 = 0;
  *(undefined ***)this_00 = &PTR_onRefCountZero_0010fab8;
  *(TestClass **)(this_00 + 1) = this;
  *(code **)&this_00[1].field_0x8 = SyncRetFunc2;
  *(undefined8 *)&this_00[1].field_0x10 = 0;
  *(uint64_t **)(this_00 + 2) = p1;
  *(uint32_t *)&this_00[2].field_0x8 = p2;
  sVar2 = SyncRetEventAgent<bool>::send(this_00,(int)this + 8,__buf,0x10a320,in_R8D);
  return SUB81(sVar2,0);
}

Assistant:

bool SyncRetFunc2(uint64_t &p1, uint32_t p2)
	{
		if (not mEventThread.isThreadCurrent())
		{
			bool result = false;
			SyncRetEventAgent2<TestClass, bool, uint64_t &, uint32_t>* agent =
				jh_new SyncRetEventAgent2<TestClass, bool, uint64_t &, uint32_t>(this, &TestClass::SyncRetFunc2,
					p1, p2);
			result = agent->send(&mEventThread);
			LOG_INFO("RetVal(%d) p1(%llu) p2(%u)", result, p1, p2);
			return result;
		}
		
		LOG_INFO("Received p1(%llu) p2(%u)", p1, p2);
		p1+=1024;
		p2+=512;
		return true;
	}